

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O1

char * affinity_mask_str_r(cpu_affinity_mask_t *affinity_mask,char *buffer,uint32_t buffer_len)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  
  if (buffer_len < 2) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0x1fff;
    bVar1 = 0;
    uVar4 = 0;
    do {
      if (((bool)(uVar3 < 4 | bVar1)) || (affinity_mask->__bits[uVar3] != '\0')) {
        snprintf(buffer + uVar4,3,"%02X",(ulong)affinity_mask->__bits[uVar3]);
        uVar4 = uVar4 + 2;
        bVar1 = 1;
      }
      uVar2 = (ulong)uVar4;
      bVar5 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while ((bVar5) && (uVar4 + 1 < buffer_len));
  }
  buffer[uVar2] = '\0';
  return buffer;
}

Assistant:

char* affinity_mask_str_r(cpu_affinity_mask_t* affinity_mask, char* buffer, uint32_t buffer_len)
{
	logical_cpu_t mask_index = __MASK_SETSIZE - 1;
	logical_cpu_t str_index = 0;
	bool do_print = false;

	while (((uint32_t) str_index) + 1 < buffer_len) {
		if (do_print || (mask_index < 4) || (affinity_mask->__bits[mask_index] != 0x00)) {
			snprintf(&buffer[str_index], 3, "%02X", affinity_mask->__bits[mask_index]);
			do_print = true;
			str_index += 2;
		}
		/* mask_index in unsigned, so we cannot decrement it beyond 0 */
		if (mask_index == 0)
			break;
		mask_index--;
	}
	buffer[str_index] = '\0';

	return buffer;
}